

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtx_timedlock.c
# Opt level: O1

int mtx_timedlock(mtx_t *mtx,timespec *ts)

{
  int iVar1;
  int iVar2;
  
  iVar1 = pthread_mutex_timedlock((pthread_mutex_t *)mtx,(timespec *)ts);
  iVar2 = 1;
  if (iVar1 != 0) {
    iVar2 = (uint)(iVar1 != 0x6e) * 3;
  }
  return iVar2;
}

Assistant:

int mtx_timedlock( mtx_t * _PDCLIB_restrict mtx, const struct timespec * _PDCLIB_restrict ts )
{
    switch ( pthread_mutex_timedlock( mtx, ts ) )
    {
        case 0:
            return thrd_success;

        case ETIMEDOUT:
            return thrd_timedout;

        default:
            return thrd_error;
    }
}